

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

BlockHash * __thiscall cfd::core::Block::GetBlockHash(BlockHash *__return_storage_ptr__,Block *this)

{
  ByteData local_48;
  ByteData256 local_30;
  Block *local_18;
  Block *this_local;
  
  local_18 = this;
  this_local = (Block *)__return_storage_ptr__;
  SerializeBlockHeader(&local_48,this);
  HashUtil::Sha256D(&local_30,&local_48);
  BlockHash::BlockHash(__return_storage_ptr__,&local_30);
  ByteData256::~ByteData256(&local_30);
  ByteData::~ByteData(&local_48);
  return __return_storage_ptr__;
}

Assistant:

BlockHash Block::GetBlockHash() const {
  return BlockHash(HashUtil::Sha256D(SerializeBlockHeader()));
}